

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_api_base.h
# Opt level: O0

void __thiscall
mp::BasicFlatModelAPI::
AddConstraint<mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>>>
          (BasicFlatModelAPI *this,
          ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_> *param_2)

{
  BasicCStringRef<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Error *in_stack_ffffffffffffffa8;
  CStringRef in_stack_ffffffffffffffb0;
  
  this_00 = (BasicCStringRef<char> *)__cxa_allocate_exception(0x18);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff87;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      ComplementarityConstraint<mp::AlgebraicExpression<mp::QuadAndLinTerms>_>::GetTypeName();
  std::operator+(__lhs,(char *)this_00);
  std::operator+(__lhs,(char *)this_00);
  fmt::BasicCStringRef<char>::BasicCStringRef(this_00,s);
  Error::Error(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa4);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

void AddConstraint(const Constraint& ) {
    MP_RAISE(
          std::string("Not handling constraint type '") +
          Constraint::GetTypeName() +
          "'. Provide a handler or a converter method");
  }